

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u32 selFlags,
                         Expr *pLimit)

{
  sqlite3 *db;
  int iVar1;
  u64 in_RCX;
  void *in_RDX;
  Db *in_RSI;
  sqlite3 *in_RDI;
  i64 in_R8;
  i64 in_R9;
  long in_FS_OFFSET;
  undefined4 uStack0000000000000008;
  undefined4 uStack000000000000000c;
  Select *pAllocated;
  Select *pNew;
  Select standin;
  Expr *in_stack_ffffffffffffff28;
  sqlite3 *in_stack_ffffffffffffff30;
  sqlite3 *psVar2;
  void *local_a0;
  Db *local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  memset(&stack0xffffffffffffff78,0xaa,0x80);
  db = (sqlite3 *)sqlite3DbMallocRawNN(psVar2,(u64)in_stack_ffffffffffffff30);
  psVar2 = db;
  if (db == (sqlite3 *)0x0) {
    psVar2 = (sqlite3 *)&stack0xffffffffffffff78;
  }
  local_98 = in_RSI;
  if (in_RSI == (Db *)0x0) {
    in_stack_ffffffffffffff30 = in_RDI;
    sqlite3Expr(db,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff28);
    local_98 = (Db *)sqlite3ExprListAppend
                               ((Parse *)db,(ExprList *)in_stack_ffffffffffffff30,
                                in_stack_ffffffffffffff28);
  }
  psVar2->aDb = local_98;
  *(undefined1 *)&psVar2->pVfs = 0x8b;
  *(undefined4 *)((long)&psVar2->pVfs + 4) = pAllocated._0_4_;
  *(undefined4 *)&psVar2->pVdbe = 0;
  *(undefined4 *)((long)&psVar2->pVdbe + 4) = 0;
  iVar1 = in_RDI->aLimit[3] + 1;
  in_RDI->aLimit[3] = iVar1;
  *(int *)&psVar2->pDfltColl = iVar1;
  *(undefined4 *)((long)&psVar2->pDfltColl + 4) = 0xffffffff;
  *(undefined4 *)&psVar2->mutex = 0xffffffff;
  *(undefined2 *)((long)&psVar2->pVfs + 2) = 0;
  local_a0 = in_RDX;
  if (in_RDX == (void *)0x0) {
    local_a0 = sqlite3DbMallocZero(in_stack_ffffffffffffff30,(u64)in_stack_ffffffffffffff28);
  }
  *(void **)&psVar2->nDb = local_a0;
  psVar2->flags = in_RCX;
  psVar2->lastRowid = in_R8;
  psVar2->szMmap = in_R9;
  psVar2->nSchemaLock = uStack0000000000000008;
  psVar2->openFlags = uStack000000000000000c;
  psVar2->errCode = 0;
  psVar2->errByteOffset = 0;
  psVar2->errMask = 0;
  psVar2->iSysErrno = 0;
  *(Select **)&psVar2->dbOptFlags = pNew;
  psVar2->bBenignMalloc = '\0';
  psVar2->dfltLockMode = '\0';
  psVar2->nextAutovac = '\0';
  psVar2->suppressErr = '\0';
  psVar2->vtabOnConflict = '\0';
  psVar2->isTransactionSavepoint = '\0';
  psVar2->mTrace = '\0';
  psVar2->noSharedCache = '\0';
  psVar2->nSqlExec = '\0';
  psVar2->eOpenState = '\0';
  *(undefined2 *)&psVar2->field_0x72 = 0;
  psVar2->nextPagesize = 0;
  psVar2->nChange = 0;
  if (*(char *)((long)&in_RDI->pVfs->xDlClose + 7) != '\0') {
    clearSelect(psVar2,(Select *)db,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    db = (sqlite3 *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Select *)db;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u32 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit          /* LIMIT value.  NULL means not used */
){
  Select *pNew, *pAllocated;
  Select standin;
  pAllocated = pNew = sqlite3DbMallocRawNN(pParse->db, sizeof(*pNew) );
  if( pNew==0 ){
    assert( pParse->db->mallocFailed );
    pNew = &standin;
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0,
                                   sqlite3Expr(pParse->db,TK_ASTERISK,0));
  }
  pNew->pEList = pEList;
  pNew->op = TK_SELECT;
  pNew->selFlags = selFlags;
  pNew->iLimit = 0;
  pNew->iOffset = 0;
  pNew->selId = ++pParse->nSelect;
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->nSelectRow = 0;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(pParse->db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->pPrior = 0;
  pNew->pNext = 0;
  pNew->pLimit = pLimit;
  pNew->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  pNew->pWin = 0;
  pNew->pWinDefn = 0;
#endif
  if( pParse->db->mallocFailed ) {
    clearSelect(pParse->db, pNew, pNew!=&standin);
    pAllocated = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  return pAllocated;
}